

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkTestTools.cpp
# Opt level: O0

void __thiscall test::FunctionTimer::FunctionTimer(FunctionTimer *this,string *name)

{
  string *in_RSI;
  long in_RDI;
  
  std::mutex::mutex((mutex *)0x112e8d);
  *(undefined8 *)(in_RDI + 0x28) = 0;
  *(undefined8 *)(in_RDI + 0x30) = 0;
  *(undefined8 *)(in_RDI + 0x38) = 0;
  std::__cxx11::string::string((string *)(in_RDI + 0x40));
  std::__cxx11::string::operator=((string *)(in_RDI + 0x40),in_RSI);
  return;
}

Assistant:

FunctionTimer::FunctionTimer(const std::string& name)
{
    FunctionName = name;
}